

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

char * get_ea_mode_str(uint instruction,uint size)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool local_c9;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  bool local_61;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint temp_value;
  uint comma;
  uint postindex;
  uint preindex;
  char index_reg [8];
  char base_reg [4];
  uint outer;
  uint base;
  uint extension;
  uint size_local;
  uint instruction_local;
  
  bVar2 = false;
  pcVar6 = get_ea_mode_str::b1;
  if (get_ea_mode_str::mode == get_ea_mode_str::b1) {
    pcVar6 = get_ea_mode_str::b2;
  }
  get_ea_mode_str::mode = pcVar6;
  switch(instruction & 0x3f) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    sprintf(pcVar6,"D%d",(ulong)(instruction & 7));
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    sprintf(pcVar6,"A%d",(ulong)(instruction & 7));
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    sprintf(pcVar6,"(A%d)",(ulong)(instruction & 7));
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    sprintf(pcVar6,"(A%d)+",(ulong)(instruction & 7));
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    sprintf(pcVar6,"-(A%d)",(ulong)(instruction & 7));
    break;
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    uVar5 = dasm_read_imm_16(2);
    pcVar8 = make_signed_hex_str_16(uVar5);
    sprintf(pcVar6,"(%s,A%d)",pcVar8,(ulong)(instruction & 7));
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    uVar5 = dasm_read_imm_16(2);
    pcVar6 = get_ea_mode_str::mode;
    if ((uVar5 & 0x100) == 0) {
      if ((uVar5 & 0xff) == 0) {
        uVar9 = 0x44;
        if ((uVar5 & 0x8000) != 0) {
          uVar9 = 0x41;
        }
        uVar10 = 0x77;
        if ((uVar5 & 0x800) != 0) {
          uVar10 = 0x6c;
        }
        sprintf(get_ea_mode_str::mode,"(A%d,%c%d.%c",(ulong)(instruction & 7),uVar9,
                (ulong)(uVar5 >> 0xc & 7),uVar10);
      }
      else {
        pcVar8 = make_signed_hex_str_8(uVar5);
        uVar9 = 0x44;
        if ((uVar5 & 0x8000) != 0) {
          uVar9 = 0x41;
        }
        uVar3 = 0x77;
        if ((uVar5 & 0x800) != 0) {
          uVar3 = 0x6c;
        }
        sprintf(pcVar6,"(%s,A%d,%c%d.%c",pcVar8,(ulong)(instruction & 7),uVar9,
                (ulong)(uVar5 >> 0xc & 7),uVar3);
      }
      pcVar6 = get_ea_mode_str::mode;
      if ((uVar5 >> 9 & 3) != 0) {
        sVar7 = strlen(get_ea_mode_str::mode);
        sprintf(pcVar6 + sVar7,"*%d",(ulong)(uint)(1 << ((byte)(uVar5 >> 9) & 3)));
      }
      strcat(get_ea_mode_str::mode,")");
    }
    else if (((uVar5 & 0xe4) == 0xc4) || ((uVar5 & 0xe2) == 0xc0)) {
      strcpy(get_ea_mode_str::mode,"0");
    }
    else {
      if ((uVar5 & 0x30) < 0x11) {
        local_50 = 0;
      }
      else {
        if ((uVar5 & 0x30) == 0x30) {
          local_4c = dasm_read_imm_32(4);
        }
        else {
          local_4c = dasm_read_imm_16(2);
        }
        local_50 = local_4c;
      }
      if (((uVar5 & 3) < 2) || (0x43 < (uVar5 & 0x47))) {
        local_58 = 0;
      }
      else {
        if (((uVar5 & 3) == 3) && ((uVar5 & 0x47) < 0x44)) {
          local_54 = dasm_read_imm_32(4);
        }
        else {
          local_54 = dasm_read_imm_16(2);
        }
        local_58 = local_54;
      }
      index_reg[4] = (undefined1)local_58;
      index_reg[5] = local_58._1_1_;
      index_reg[6] = local_58._2_1_;
      index_reg[7] = local_58._3_1_;
      if ((uVar5 & 0x80) == 0) {
        sprintf(index_reg,"A%d",(ulong)(instruction & 7));
      }
      else {
        index_reg[0] = '\0';
      }
      if ((uVar5 & 0x40) == 0) {
        uVar9 = 0x44;
        if ((uVar5 & 0x8000) != 0) {
          uVar9 = 0x41;
        }
        uVar10 = 0x77;
        if ((uVar5 & 0x800) != 0) {
          uVar10 = 0x6c;
        }
        sprintf((char *)&postindex,"%c%d.%c",uVar9,(ulong)(uVar5 >> 0xc & 7),uVar10);
        if ((uVar5 >> 9 & 3) != 0) {
          sVar7 = strlen((char *)&postindex);
          sprintf((char *)((long)&postindex + sVar7),"*%d",
                  (ulong)(uint)(1 << ((byte)(uVar5 >> 9) & 3)));
        }
      }
      else {
        postindex._0_1_ = '\0';
      }
      local_61 = (uVar5 & 7) != 0 && (uVar5 & 7) < 4;
      bVar1 = 4 < (uVar5 & 7);
      strcpy(get_ea_mode_str::mode,"(");
      if ((local_61) || (bVar1)) {
        strcat(get_ea_mode_str::mode,"[");
      }
      pcVar6 = get_ea_mode_str::mode;
      if (local_50 != 0) {
        if ((uVar5 & 0x30) == 0x30) {
          pcVar8 = make_signed_hex_str_32(local_50);
          strcat(pcVar6,pcVar8);
        }
        else {
          pcVar8 = make_signed_hex_str_16(local_50);
          strcat(pcVar6,pcVar8);
        }
        bVar2 = true;
      }
      if (index_reg[0] != '\0') {
        if (bVar2) {
          strcat(get_ea_mode_str::mode,",");
        }
        strcat(get_ea_mode_str::mode,index_reg);
        bVar2 = true;
      }
      if (bVar1) {
        strcat(get_ea_mode_str::mode,"]");
        bVar2 = true;
      }
      if ((char)postindex != '\0') {
        if (bVar2) {
          strcat(get_ea_mode_str::mode,",");
        }
        strcat(get_ea_mode_str::mode,(char *)&postindex);
        bVar2 = true;
      }
      if (local_61) {
        strcat(get_ea_mode_str::mode,"]");
        bVar2 = true;
      }
      if (index_reg._4_4_ != 0) {
        if (bVar2) {
          strcat(get_ea_mode_str::mode,",");
        }
        pcVar6 = get_ea_mode_str::mode;
        if (((uVar5 & 3) == 3) && ((uVar5 & 0x47) < 0x44)) {
          pcVar8 = make_signed_hex_str_32(index_reg._4_4_);
          strcat(pcVar6,pcVar8);
        }
        else {
          pcVar8 = make_signed_hex_str_16(index_reg._4_4_);
          strcat(pcVar6,pcVar8);
        }
      }
      strcat(get_ea_mode_str::mode,")");
    }
    break;
  case 0x38:
    uVar5 = dasm_read_imm_16(2);
    sprintf(pcVar6,"$%x.w",(ulong)uVar5);
    break;
  case 0x39:
    uVar5 = dasm_read_imm_32(4);
    sprintf(pcVar6,"$%x.l",(ulong)uVar5);
    break;
  case 0x3a:
    uVar5 = dasm_read_imm_16(2);
    pcVar6 = get_ea_mode_str::mode;
    pcVar8 = make_signed_hex_str_16(uVar5);
    sprintf(pcVar6,"(%s,PC)",pcVar8);
    iVar4 = make_int_16(uVar5);
    sprintf(g_helper_str,"; ($%x)",(ulong)((iVar4 + g_cpu_pc) - 2));
    break;
  case 0x3b:
    uVar5 = dasm_read_imm_16(2);
    pcVar6 = get_ea_mode_str::mode;
    if ((uVar5 & 0x100) == 0) {
      if ((uVar5 & 0xff) == 0) {
        uVar9 = 0x44;
        if ((uVar5 & 0x8000) != 0) {
          uVar9 = 0x41;
        }
        uVar10 = 0x77;
        if ((uVar5 & 0x800) != 0) {
          uVar10 = 0x6c;
        }
        sprintf(get_ea_mode_str::mode,"(PC,%c%d.%c",uVar9,(ulong)(uVar5 >> 0xc & 7),uVar10);
      }
      else {
        pcVar8 = make_signed_hex_str_8(uVar5);
        uVar9 = 0x44;
        if ((uVar5 & 0x8000) != 0) {
          uVar9 = 0x41;
        }
        uVar10 = 0x77;
        if ((uVar5 & 0x800) != 0) {
          uVar10 = 0x6c;
        }
        sprintf(pcVar6,"(%s,PC,%c%d.%c",pcVar8,uVar9,(ulong)(uVar5 >> 0xc & 7),uVar10);
      }
      pcVar6 = get_ea_mode_str::mode;
      if ((uVar5 >> 9 & 3) != 0) {
        sVar7 = strlen(get_ea_mode_str::mode);
        sprintf(pcVar6 + sVar7,"*%d",(ulong)(uint)(1 << ((byte)(uVar5 >> 9) & 3)));
      }
      strcat(get_ea_mode_str::mode,")");
    }
    else if (((uVar5 & 0xe4) == 0xc4) || ((uVar5 & 0xe2) == 0xc0)) {
      strcpy(get_ea_mode_str::mode,"0");
    }
    else {
      if ((uVar5 & 0x30) < 0x11) {
        local_b8 = 0;
      }
      else {
        if ((uVar5 & 0x30) == 0x30) {
          local_b4 = dasm_read_imm_32(4);
        }
        else {
          local_b4 = dasm_read_imm_16(2);
        }
        local_b8 = local_b4;
      }
      if (((uVar5 & 3) < 2) || (0x43 < (uVar5 & 0x47))) {
        local_c0 = 0;
      }
      else {
        if (((uVar5 & 3) == 3) && ((uVar5 & 0x47) < 0x44)) {
          local_bc = dasm_read_imm_32(4);
        }
        else {
          local_bc = dasm_read_imm_16(2);
        }
        local_c0 = local_bc;
      }
      index_reg[4] = (undefined1)local_c0;
      index_reg[5] = local_c0._1_1_;
      index_reg[6] = local_c0._2_1_;
      index_reg[7] = local_c0._3_1_;
      if ((uVar5 & 0x80) == 0) {
        strcpy(index_reg,"PC");
      }
      else {
        index_reg[0] = '\0';
      }
      if ((uVar5 & 0x40) == 0) {
        uVar9 = 0x44;
        if ((uVar5 & 0x8000) != 0) {
          uVar9 = 0x41;
        }
        uVar10 = 0x77;
        if ((uVar5 & 0x800) != 0) {
          uVar10 = 0x6c;
        }
        sprintf((char *)&postindex,"%c%d.%c",uVar9,(ulong)(uVar5 >> 0xc & 7),uVar10);
        if ((uVar5 >> 9 & 3) != 0) {
          sVar7 = strlen((char *)&postindex);
          sprintf((char *)((long)&postindex + sVar7),"*%d",
                  (ulong)(uint)(1 << ((byte)(uVar5 >> 9) & 3)));
        }
      }
      else {
        postindex._0_1_ = '\0';
      }
      local_c9 = (uVar5 & 7) != 0 && (uVar5 & 7) < 4;
      bVar1 = 4 < (uVar5 & 7);
      strcpy(get_ea_mode_str::mode,"(");
      if ((local_c9) || (bVar1)) {
        strcat(get_ea_mode_str::mode,"[");
      }
      pcVar6 = get_ea_mode_str::mode;
      if (local_b8 != 0) {
        if ((uVar5 & 0x30) == 0x30) {
          pcVar8 = make_signed_hex_str_32(local_b8);
          strcat(pcVar6,pcVar8);
        }
        else {
          pcVar8 = make_signed_hex_str_16(local_b8);
          strcat(pcVar6,pcVar8);
        }
        bVar2 = true;
      }
      if (index_reg[0] != '\0') {
        if (bVar2) {
          strcat(get_ea_mode_str::mode,",");
        }
        strcat(get_ea_mode_str::mode,index_reg);
        bVar2 = true;
      }
      if (bVar1) {
        strcat(get_ea_mode_str::mode,"]");
        bVar2 = true;
      }
      if ((char)postindex != '\0') {
        if (bVar2) {
          strcat(get_ea_mode_str::mode,",");
        }
        strcat(get_ea_mode_str::mode,(char *)&postindex);
        bVar2 = true;
      }
      if (local_c9) {
        strcat(get_ea_mode_str::mode,"]");
        bVar2 = true;
      }
      if (index_reg._4_4_ != 0) {
        if (bVar2) {
          strcat(get_ea_mode_str::mode,",");
        }
        pcVar6 = get_ea_mode_str::mode;
        if (((uVar5 & 3) == 3) && ((uVar5 & 0x47) < 0x44)) {
          pcVar8 = make_signed_hex_str_32(index_reg._4_4_);
          strcat(pcVar6,pcVar8);
        }
        else {
          pcVar8 = make_signed_hex_str_16(index_reg._4_4_);
          strcat(pcVar6,pcVar8);
        }
      }
      strcat(get_ea_mode_str::mode,")");
    }
    break;
  case 0x3c:
    pcVar8 = get_imm_str_u(size);
    sprintf(pcVar6,"%s",pcVar8);
    break;
  default:
    sprintf(pcVar6,"INVALID $%x",(ulong)(instruction & 0x3f));
  }
  return get_ea_mode_str::mode;
}

Assistant:

static char* get_ea_mode_str(uint instruction, uint size)
{
	static char b1[64];
	static char b2[64];
	static char* mode = b2;
	uint extension;
	uint base;
	uint outer;
	char base_reg[4];
	char index_reg[8];
	uint preindex;
	uint postindex;
	uint comma = 0;
	uint temp_value;

	/* Switch buffers so we don't clobber on a double-call to this function */
	mode = mode == b1 ? b2 : b1;

	switch(instruction & 0x3f)
	{
		case 0x00: case 0x01: case 0x02: case 0x03: case 0x04: case 0x05: case 0x06: case 0x07:
		/* data register direct */
			sprintf(mode, "D%d", instruction&7);
			break;
		case 0x08: case 0x09: case 0x0a: case 0x0b: case 0x0c: case 0x0d: case 0x0e: case 0x0f:
		/* address register direct */
			sprintf(mode, "A%d", instruction&7);
			break;
		case 0x10: case 0x11: case 0x12: case 0x13: case 0x14: case 0x15: case 0x16: case 0x17:
		/* address register indirect */
			sprintf(mode, "(A%d)", instruction&7);
			break;
		case 0x18: case 0x19: case 0x1a: case 0x1b: case 0x1c: case 0x1d: case 0x1e: case 0x1f:
		/* address register indirect with postincrement */
			sprintf(mode, "(A%d)+", instruction&7);
			break;
		case 0x20: case 0x21: case 0x22: case 0x23: case 0x24: case 0x25: case 0x26: case 0x27:
		/* address register indirect with predecrement */
			sprintf(mode, "-(A%d)", instruction&7);
			break;
		case 0x28: case 0x29: case 0x2a: case 0x2b: case 0x2c: case 0x2d: case 0x2e: case 0x2f:
		/* address register indirect with displacement*/
			sprintf(mode, "(%s,A%d)", make_signed_hex_str_16(read_imm_16()), instruction&7);
			break;
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34: case 0x35: case 0x36: case 0x37:
		/* address register indirect with index */
			extension = read_imm_16();

			if(EXT_FULL(extension))
			{
				if(EXT_EFFECTIVE_ZERO(extension))
				{
					strcpy(mode, "0");
					break;
				}
				base = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				outer = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				if(EXT_BASE_REGISTER_PRESENT(extension))
					sprintf(base_reg, "A%d", instruction&7);
				else
					*base_reg = 0;
				if(EXT_INDEX_REGISTER_PRESENT(extension))
				{
					sprintf(index_reg, "%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
					if(EXT_INDEX_SCALE(extension))
						sprintf(index_reg+strlen(index_reg), "*%d", 1 << EXT_INDEX_SCALE(extension));
				}
				else
					*index_reg = 0;
				preindex = (extension&7) > 0 && (extension&7) < 4;
				postindex = (extension&7) > 4;

				strcpy(mode, "(");
				if(preindex || postindex)
					strcat(mode, "[");
				if(base)
				{
					if (EXT_BASE_DISPLACEMENT_LONG(extension))
					{
						strcat(mode, make_signed_hex_str_32(base));
					}
					else
					{
						strcat(mode, make_signed_hex_str_16(base));
					}
					comma = 1;
				}
				if(*base_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, base_reg);
					comma = 1;
				}
				if(postindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(*index_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, index_reg);
					comma = 1;
				}
				if(preindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(outer)
				{
					if(comma)
						strcat(mode, ",");
                    if (EXT_OUTER_DISPLACEMENT_LONG(extension)) {
                        strcat(mode, make_signed_hex_str_32(outer));
                    } else {
                        strcat(mode, make_signed_hex_str_16(outer));
                    }
				}
				strcat(mode, ")");
				break;
			}

			if(EXT_8BIT_DISPLACEMENT(extension) == 0)
				sprintf(mode, "(A%d,%c%d.%c", instruction&7, EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			else
				sprintf(mode, "(%s,A%d,%c%d.%c", make_signed_hex_str_8(extension), instruction&7, EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			if(EXT_INDEX_SCALE(extension))
				sprintf(mode+strlen(mode), "*%d", 1 << EXT_INDEX_SCALE(extension));
			strcat(mode, ")");
			break;
		case 0x38:
		/* absolute short address */
			sprintf(mode, "$%x.w", read_imm_16());
			break;
		case 0x39:
		/* absolute long address */
			sprintf(mode, "$%x.l", read_imm_32());
			break;
		case 0x3a:
		/* program counter with displacement */
			temp_value = read_imm_16();
			sprintf(mode, "(%s,PC)", make_signed_hex_str_16(temp_value));
			sprintf(g_helper_str, "; ($%x)", (make_int_16(temp_value) + g_cpu_pc-2) & 0xffffffff);
			break;
		case 0x3b:
		/* program counter with index */
			extension = read_imm_16();

			if(EXT_FULL(extension))
			{
				if(EXT_EFFECTIVE_ZERO(extension))
				{
					strcpy(mode, "0");
					break;
				}
				base = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				outer = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				if(EXT_BASE_REGISTER_PRESENT(extension))
					strcpy(base_reg, "PC");
				else
					*base_reg = 0;
				if(EXT_INDEX_REGISTER_PRESENT(extension))
				{
					sprintf(index_reg, "%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
					if(EXT_INDEX_SCALE(extension))
						sprintf(index_reg+strlen(index_reg), "*%d", 1 << EXT_INDEX_SCALE(extension));
				}
				else
					*index_reg = 0;
				preindex = (extension&7) > 0 && (extension&7) < 4;
				postindex = (extension&7) > 4;

				strcpy(mode, "(");
				if(preindex || postindex)
					strcat(mode, "[");
                if(base)
                {
                    if (EXT_BASE_DISPLACEMENT_LONG(extension))
                    {
                        strcat(mode, make_signed_hex_str_32(base));
                    }
                    else
                    {
                        strcat(mode, make_signed_hex_str_16(base));
                    }
					comma = 1;
				}
				if(*base_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, base_reg);
					comma = 1;
				}
				if(postindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(*index_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, index_reg);
					comma = 1;
				}
				if(preindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(outer)
				{
					if(comma)
						strcat(mode, ",");
                    if (EXT_OUTER_DISPLACEMENT_LONG(extension)) {
                        strcat(mode, make_signed_hex_str_32(outer));
                    } else {
                        strcat(mode, make_signed_hex_str_16(outer));
                    }
				}
				strcat(mode, ")");
				break;
			}

			if(EXT_8BIT_DISPLACEMENT(extension) == 0)
				sprintf(mode, "(PC,%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			else
				sprintf(mode, "(%s,PC,%c%d.%c", make_signed_hex_str_8(extension), EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			if(EXT_INDEX_SCALE(extension))
				sprintf(mode+strlen(mode), "*%d", 1 << EXT_INDEX_SCALE(extension));
			strcat(mode, ")");
			break;
		case 0x3c:
		/* Immediate */
			sprintf(mode, "%s", get_imm_str_u(size));
			break;
		default:
			sprintf(mode, "INVALID $%x", instruction & 0x3f);
	}
	return mode;
}